

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O1

void PLM::PredictVelOnXFace
               (Box *xebox,int ncomp,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  pair<bool,_bool> pVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  uint uVar45;
  long lVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  int iVar52;
  double *pdVar53;
  bool bVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  undefined1 auVar67 [16];
  double dVar68;
  double dVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  undefined1 auVar79 [16];
  Real qm;
  BCRec *bc;
  long local_2c8;
  double *local_2c0;
  double local_2b8;
  ulong local_288;
  double *local_270;
  double *local_1e0;
  ulong local_1c8;
  double *local_140;
  double *local_138;
  double *local_130;
  
  dVar55 = dt / (geom->super_CoordSys).dx[0];
  iVar1 = (geom->domain).smallend.vect[0];
  iVar2 = (geom->domain).bigend.vect[0];
  pVar33 = anon_unknown.dwarf_4dee56::has_extdir_or_ho
                     ((h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,ncomp,0);
  if (((((ushort)pVar33 & 1) == 0) || (iVar1 < (xebox->smallend).vect[0] + -1)) &&
     ((((ushort)pVar33 >> 8 & 1) == 0 || ((xebox->bigend).vect[0] < iVar2)))) {
    if (0 < ncomp) {
      lVar15 = Ipx->jstride;
      lVar16 = Imx->jstride;
      iVar1 = (xebox->smallend).vect[1];
      lVar37 = (long)iVar1;
      iVar2 = (xebox->smallend).vect[0];
      lVar35 = (long)iVar2;
      iVar3 = (vcc->begin).y;
      local_2c0 = Ipx->p + (((lVar37 - (Ipx->begin).y) * lVar15 + lVar35 + -1) -
                           (long)(Ipx->begin).x);
      lVar17 = vcc->jstride;
      iVar4 = (vcc->begin).x;
      lVar36 = (long)(q->begin).y;
      lVar18 = q->jstride;
      iVar5 = (q->begin).x;
      iVar52 = iVar2 - iVar5;
      pdVar19 = q->p;
      lVar20 = q->kstride;
      lVar21 = q->nstride;
      iVar6 = (q->begin).z;
      pdVar22 = vcc->p;
      lVar23 = vcc->kstride;
      iVar8 = (vcc->begin).z;
      local_1e0 = Imx->p + (((lVar37 - (Imx->begin).y) * lVar16 + lVar35) - (long)(Imx->begin).x);
      lVar24 = Ipx->kstride;
      lVar25 = Ipx->nstride;
      iVar9 = (Ipx->begin).z;
      lVar26 = Imx->kstride;
      lVar27 = Imx->nstride;
      iVar10 = (Imx->begin).z;
      iVar11 = (xebox->smallend).vect[2];
      iVar12 = (xebox->bigend).vect[2];
      iVar13 = (xebox->bigend).vect[0];
      iVar14 = (xebox->bigend).vect[1];
      local_270 = pdVar19 + (((lVar37 - lVar36) * lVar18 + lVar35 + -1) - (long)iVar5);
      local_288 = 0;
      do {
        if (iVar11 <= iVar12) {
          lVar44 = local_288 * lVar21;
          iVar5 = iVar11;
          do {
            if (iVar1 <= iVar14) {
              lVar48 = (long)iVar5;
              pdVar34 = (double *)((lVar48 - iVar10) * lVar26 * 8 + (long)local_1e0);
              pdVar53 = (double *)((lVar48 - iVar9) * lVar24 * 8 + (long)local_2c0);
              lVar40 = (long)pdVar22 +
                       (lVar48 - iVar8) * lVar23 * 8 +
                       lVar35 * 8 + (lVar37 - iVar3) * lVar17 * 8 + (long)iVar4 * -8;
              pdVar50 = (double *)((lVar48 - iVar6) * lVar20 * 8 + (long)local_270);
              lVar51 = (iVar5 - iVar6) * lVar20;
              lVar48 = lVar37;
              do {
                if (iVar2 <= iVar13) {
                  lVar46 = (lVar48 - lVar36) * lVar18;
                  lVar49 = 0;
                  do {
                    iVar38 = (int)lVar49;
                    dVar28 = pdVar50[lVar49];
                    dVar29 = (pdVar50 + lVar49)[1];
                    dVar56 = dVar28 - pdVar19[lVar44 + lVar51 + lVar46 + (iVar52 + -2 + iVar38)];
                    dVar58 = dVar29 - dVar28;
                    dVar57 = 0.0;
                    dVar61 = ABS(dVar56);
                    dVar69 = ABS(dVar58);
                    dVar65 = 0.0;
                    if (0.0 <= dVar58 * dVar56) {
                      dVar65 = dVar69;
                      if (dVar61 <= dVar69) {
                        dVar65 = dVar61;
                      }
                      dVar65 = dVar65 + dVar65;
                    }
                    dVar59 = pdVar19[lVar44 + lVar51 + lVar46 + (iVar52 + 2 + iVar38)] -
                             pdVar19[lVar44 + lVar51 + lVar46 + (iVar52 + iVar38 + 1)];
                    dVar72 = pdVar19[lVar44 + lVar51 + lVar46 + (iVar52 + iVar38 + 1)] - dVar29;
                    if (0.0 <= dVar72 * dVar59) {
                      dVar57 = ABS(dVar59);
                      if (ABS(dVar72) <= ABS(dVar59)) {
                        dVar57 = ABS(dVar72);
                      }
                      dVar57 = dVar57 + dVar57;
                    }
                    dVar76 = 0.0;
                    dVar68 = 0.0;
                    if (0.0 <= dVar72 * dVar58) {
                      dVar68 = ABS(dVar72);
                      if (ABS(dVar58) <= ABS(dVar72)) {
                        dVar68 = ABS(dVar58);
                      }
                      dVar68 = dVar68 + dVar68;
                    }
                    dVar66 = pdVar19[lVar44 + lVar51 + lVar46 + (iVar52 + -2 + iVar38)] -
                             pdVar19[lVar44 + lVar51 + lVar46 + (iVar52 + -3 + iVar38)];
                    if (0.0 <= dVar56 * dVar66) {
                      dVar76 = ABS(dVar56);
                      if (ABS(dVar66) <= ABS(dVar56)) {
                        dVar76 = ABS(dVar66);
                      }
                      dVar76 = dVar76 + dVar76;
                    }
                    dVar73 = 0.0;
                    dVar77 = 0.0;
                    if (0.0 <= dVar72 * dVar58) {
                      dVar77 = ABS(dVar72);
                      if (ABS(dVar58) <= ABS(dVar72)) {
                        dVar77 = ABS(dVar58);
                      }
                      dVar77 = dVar77 + dVar77;
                    }
                    if (0.0 <= dVar58 * dVar56) {
                      if (dVar61 <= dVar69) {
                        dVar69 = dVar61;
                      }
                      dVar73 = dVar69 + dVar69;
                    }
                    dVar66 = (dVar66 + dVar56) * 0.5;
                    dVar75 = (dVar72 + dVar58) * 0.5;
                    auVar67._0_8_ = ABS(dVar66);
                    auVar67._8_8_ = ABS(dVar75);
                    auVar64._8_8_ = dVar77;
                    auVar64._0_8_ = dVar76;
                    auVar67 = minpd(auVar67,auVar64);
                    dVar69 = *(double *)(lVar40 + lVar49 * 8);
                    dVar56 = (dVar56 + dVar58) * 0.5;
                    dVar58 = (dVar59 + dVar72) * 0.5;
                    dVar61 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3ff0000000000000);
                    auVar79._8_8_ = dVar57;
                    auVar79._0_8_ = dVar65;
                    auVar63._0_8_ = ABS(dVar56);
                    auVar63._8_8_ = ABS(dVar58);
                    auVar64 = minpd(auVar63,auVar79);
                    dVar57 = ABS(dVar75 * 1.3333333333333333 +
                                 (auVar64._8_8_ *
                                  (double)((ulong)dVar58 & 0x8000000000000000 | 0x3ff0000000000000)
                                 + auVar64._0_8_ * dVar61) * -0.16666666666666666);
                    if (dVar68 <= dVar57) {
                      dVar57 = dVar68;
                    }
                    dVar58 = (double)((ulong)dVar75 & 0x8000000000000000 | 0x3ff0000000000000);
                    dVar65 = ABS(dVar56 * 1.3333333333333333 +
                                 (auVar67._8_8_ * dVar58 +
                                 auVar67._0_8_ *
                                 (double)((ulong)dVar66 & 0x8000000000000000 | 0x3ff0000000000000))
                                 * -0.16666666666666666);
                    if (dVar73 <= dVar65) {
                      dVar65 = dVar73;
                    }
                    pdVar53[lVar49] =
                         dVar65 * dVar61 *
                         (1.0 - *(double *)(lVar40 + -8 + lVar49 * 8) * dVar55) * 0.5 + dVar28;
                    pdVar34[lVar49] = dVar29 + dVar58 * dVar57 * (-1.0 - dVar69 * dVar55) * 0.5;
                    lVar49 = lVar49 + 1;
                  } while ((iVar13 - iVar2) + 1 != (int)lVar49);
                }
                lVar48 = lVar48 + 1;
                pdVar34 = pdVar34 + lVar16;
                pdVar53 = pdVar53 + lVar15;
                lVar40 = lVar40 + lVar17 * 8;
                pdVar50 = pdVar50 + lVar18;
              } while (iVar14 + 1 != (int)lVar48);
            }
            bVar54 = iVar5 != iVar12;
            iVar5 = iVar5 + 1;
          } while (bVar54);
        }
        local_288 = local_288 + 1;
        local_1e0 = local_1e0 + lVar27;
        local_2c0 = local_2c0 + lVar25;
        local_270 = local_270 + lVar21;
      } while (local_288 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    lVar15 = Imx->jstride;
    lVar16 = Ipx->jstride;
    iVar3 = (xebox->smallend).vect[1];
    lVar48 = (long)iVar3;
    iVar4 = (xebox->smallend).vect[0];
    lVar51 = (long)iVar4;
    iVar5 = (vcc->begin).y;
    local_138 = Ipx->p + (((lVar48 - (Ipx->begin).y) * lVar16 + lVar51 + -1) - (long)(Ipx->begin).x)
    ;
    lVar17 = vcc->jstride;
    iVar6 = (vcc->begin).x;
    lVar44 = (long)(q->begin).y;
    lVar18 = q->jstride;
    uVar7 = (q->begin).x;
    iVar38 = iVar1 - uVar7;
    iVar39 = iVar2 - uVar7;
    iVar43 = iVar4 - uVar7;
    local_130 = Imx->p + (((lVar48 - (Imx->begin).y) * lVar15 + lVar51) - (long)(Imx->begin).x);
    pdVar19 = q->p;
    lVar20 = q->kstride;
    lVar21 = q->nstride;
    iVar8 = (q->begin).z;
    pdVar22 = vcc->p;
    lVar23 = vcc->kstride;
    iVar9 = (vcc->begin).z;
    lVar24 = Imx->kstride;
    lVar25 = Imx->nstride;
    iVar10 = (Imx->begin).z;
    lVar26 = Ipx->kstride;
    lVar27 = Ipx->nstride;
    iVar11 = (Ipx->begin).z;
    iVar12 = (xebox->smallend).vect[2];
    iVar13 = (xebox->bigend).vect[2];
    iVar14 = (xebox->bigend).vect[0];
    iVar52 = (xebox->bigend).vect[1];
    lVar35 = (long)(int)(iVar1 + ~uVar7);
    lVar36 = (long)(int)((iVar1 + 1) - uVar7);
    lVar37 = (long)(int)((iVar2 + 1) - uVar7);
    local_140 = pdVar19 + (((lVar48 - lVar44) * lVar18 + lVar51 + -1) - (long)(int)uVar7);
    local_1c8 = 0;
    do {
      if (iVar12 <= iVar13) {
        lVar40 = local_1c8 * lVar21;
        iVar32 = iVar12;
        do {
          if (iVar3 <= iVar52) {
            lVar46 = (long)iVar32;
            pdVar34 = (double *)((lVar46 - iVar10) * lVar24 * 8 + (long)local_130);
            pdVar50 = (double *)((lVar46 - iVar11) * lVar26 * 8 + (long)local_138);
            lVar49 = (long)pdVar22 +
                     (lVar46 - iVar9) * lVar23 * 8 +
                     lVar51 * 8 + (lVar48 - iVar5) * lVar17 * 8 + (long)iVar6 * -8;
            pdVar53 = (double *)((lVar46 - iVar8) * lVar20 * 8 + (long)local_140);
            lVar46 = (iVar32 - iVar8) * lVar20;
            local_2c8 = lVar48;
            do {
              if (iVar4 <= iVar14) {
                uVar47 = pbc[local_1c8].bc[0] - 3;
                uVar45 = pbc[local_1c8].bc[3] - 3;
                lVar41 = (local_2c8 - lVar44) * lVar18;
                lVar42 = 0;
                do {
                  iVar30 = (int)lVar42;
                  dVar57 = pdVar19[lVar41 + lVar46 + lVar40 + (iVar43 + -2 + iVar30)];
                  dVar28 = SUB168(*(undefined1 (*) [16])(pdVar53 + lVar42),0);
                  dVar29 = SUB168(*(undefined1 (*) [16])(pdVar53 + lVar42),8);
                  dVar56 = dVar28 - dVar57;
                  dVar58 = dVar29 - dVar28;
                  dVar69 = 0.0;
                  dVar72 = (dVar58 + dVar56) * 0.5;
                  dVar59 = ABS(dVar56);
                  dVar61 = ABS(dVar58);
                  dVar65 = 0.0;
                  if (0.0 <= dVar58 * dVar56) {
                    dVar65 = dVar61;
                    if (dVar59 <= dVar61) {
                      dVar65 = dVar59;
                    }
                    dVar65 = dVar65 + dVar65;
                  }
                  dVar68 = pdVar19[lVar41 + lVar46 + lVar40 + (iVar43 + iVar30 + 1)];
                  dVar76 = pdVar19[lVar41 + lVar46 + lVar40 + (iVar43 + 2 + iVar30)] - dVar68;
                  dVar66 = dVar68 - dVar29;
                  dVar77 = (dVar66 + dVar76) * 0.5;
                  if (0.0 <= dVar66 * dVar76) {
                    dVar69 = ABS(dVar76);
                    if (ABS(dVar66) <= ABS(dVar76)) {
                      dVar69 = ABS(dVar66);
                    }
                    dVar69 = dVar69 + dVar69;
                  }
                  dVar76 = (dVar58 + dVar66) * 0.5;
                  local_2b8 = 0.0;
                  if (0.0 <= dVar58 * dVar66) {
                    local_2b8 = ABS(dVar66);
                    if (ABS(dVar58) <= ABS(dVar66)) {
                      local_2b8 = ABS(dVar58);
                    }
                    local_2b8 = local_2b8 + local_2b8;
                  }
                  dVar75 = (double)((ulong)dVar72 & 0x8000000000000000 | 0x3ff0000000000000);
                  dVar73 = ABS(dVar72);
                  if (dVar65 <= ABS(dVar72)) {
                    dVar73 = dVar65;
                  }
                  dVar73 = dVar73 * dVar75;
                  dVar65 = (double)((ulong)dVar76 & 0x8000000000000000 | 0x3ff0000000000000);
                  uVar31 = (ulong)DAT_0078ba10;
                  if ((uVar47 < 2) && (iVar1 - lVar51 == lVar42)) {
                    local_2b8 = 0.0;
                    if (0.0 <= (dVar58 + dVar58) * (dVar66 + dVar66)) {
                      local_2b8 = ABS(dVar66 + dVar66);
                      dVar69 = ABS(dVar58 + dVar58);
                      if (dVar69 <= local_2b8) {
                        local_2b8 = dVar69;
                      }
                    }
                    dVar77 = pdVar19[lVar41 + lVar46 + lVar40 + (iVar43 + 2 + iVar30)] * -0.1 +
                             dVar68 * 0.6666666666666666 +
                             dVar28 * -1.0666666666666667 + dVar29 * 0.5;
                    dVar69 = (double)((ulong)dVar77 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else {
                    dVar78 = ABS(dVar77);
                    if (dVar69 <= dVar78) {
                      dVar78 = dVar69;
                    }
                    dVar78 = dVar78 * (double)((ulong)dVar77 & 0x8000000000000000 | uVar31);
                    dVar77 = dVar76 * 1.3333333333333333 + (dVar73 + dVar78) * -0.16666666666666666;
                    dVar69 = dVar65;
                    if ((uVar47 < 2) && ((iVar1 + 1) - lVar51 == lVar42)) {
                      dVar77 = pdVar19[lVar41 + lVar46 + iVar38 + lVar40];
                      dVar73 = pdVar19[lVar41 + lVar46 + lVar36 + lVar40] - dVar77;
                      dVar62 = dVar77 - pdVar19[lVar41 + lVar46 + lVar35 + lVar40];
                      dVar73 = dVar73 + dVar73;
                      dVar62 = dVar62 + dVar62;
                      dVar60 = 0.0;
                      if (0.0 <= dVar62 * dVar73) {
                        dVar60 = ABS(dVar73);
                        dVar62 = ABS(dVar62);
                        if (dVar62 <= dVar60) {
                          dVar60 = dVar62;
                        }
                      }
                      dVar77 = pdVar19[lVar41 + lVar46 + (iVar38 + 2) + lVar40] * -0.1 +
                               pdVar19[lVar41 + lVar46 + lVar36 + lVar40] * 0.6666666666666666 +
                               pdVar19[lVar41 + lVar46 + lVar35 + lVar40] * -1.0666666666666667 +
                               dVar77 * 0.5;
                      dVar73 = ABS(dVar77);
                      if (dVar60 <= dVar73) {
                        dVar73 = dVar60;
                      }
                      dVar73 = dVar73 * (double)((ulong)dVar77 & 0x8000000000000000 | uVar31);
                      dVar77 = dVar76 * 1.3333333333333333 +
                               (dVar78 + dVar73) * -0.16666666666666666;
                    }
                  }
                  dVar78 = *(double *)(lVar49 + lVar42 * 8);
                  bVar54 = iVar2 - lVar51 != lVar42;
                  if (bVar54 || 1 < uVar45) {
                    if ((uVar45 < 2) && ((iVar2 + -1) - lVar51 == lVar42)) {
                      dVar77 = pdVar19[lVar41 + lVar46 + iVar39 + lVar40];
                      dVar60 = pdVar19[lVar41 + lVar46 + lVar37 + lVar40] - dVar77;
                      dVar74 = dVar77 - pdVar19[lVar41 + lVar46 + (int)((iVar2 + -1) - uVar7) +
                                                                  lVar40];
                      dVar60 = dVar60 + dVar60;
                      dVar74 = dVar74 + dVar74;
                      dVar62 = 0.0;
                      if (0.0 <= dVar74 * dVar60) {
                        dVar62 = ABS(dVar60);
                        dVar74 = ABS(dVar74);
                        if (dVar74 <= dVar62) {
                          dVar62 = dVar74;
                        }
                      }
                      dVar60 = pdVar19[lVar41 + lVar46 + (iVar39 + -2) + lVar40] * 0.1 +
                               pdVar19[lVar41 + lVar46 + (int)((iVar2 + -1) - uVar7) + lVar40] *
                               -0.6666666666666666 +
                               pdVar19[lVar41 + lVar46 + lVar37 + lVar40] * 1.0666666666666667 +
                               dVar77 * -0.5;
                      dVar77 = ABS(dVar60);
                      if (dVar62 <= dVar77) {
                        dVar77 = dVar62;
                      }
                      dVar77 = dVar76 * 1.3333333333333333 +
                               (dVar73 + dVar77 * (double)((ulong)dVar60 & 0x8000000000000000 |
                                                          uVar31)) * -0.16666666666666666;
                    }
                  }
                  else {
                    local_2b8 = 0.0;
                    if (0.0 <= (dVar58 + dVar58) * (dVar66 + dVar66)) {
                      local_2b8 = ABS(dVar66 + dVar66);
                      dVar69 = ABS(dVar58 + dVar58);
                      if (dVar69 <= local_2b8) {
                        local_2b8 = dVar69;
                      }
                    }
                    dVar77 = dVar57 * 0.1 +
                             dVar28 * -0.6666666666666666 +
                             dVar68 * 1.0666666666666667 + dVar29 * -0.5;
                    dVar69 = (double)((ulong)dVar77 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  dVar62 = dVar57 - pdVar19[lVar41 + lVar46 + lVar40 + (iVar43 + -3 + iVar30)];
                  dVar74 = (dVar56 + dVar62) * 0.5;
                  dVar60 = 0.0;
                  dVar73 = 0.0;
                  if (0.0 <= dVar56 * dVar62) {
                    dVar73 = ABS(dVar56);
                    if (ABS(dVar62) <= ABS(dVar56)) {
                      dVar73 = ABS(dVar62);
                    }
                    dVar73 = dVar73 + dVar73;
                  }
                  if (0.0 <= dVar58 * dVar66) {
                    dVar60 = ABS(dVar66);
                    if (ABS(dVar58) <= ABS(dVar66)) {
                      dVar60 = ABS(dVar58);
                    }
                    dVar60 = dVar60 + dVar60;
                  }
                  dVar66 = 0.0;
                  if (0.0 <= dVar58 * dVar56) {
                    if (dVar59 <= dVar61) {
                      dVar61 = dVar59;
                    }
                    dVar66 = dVar61 + dVar61;
                  }
                  dVar61 = ABS(dVar74);
                  if (dVar73 <= dVar61) {
                    dVar61 = dVar73;
                  }
                  dVar61 = dVar61 * (double)((ulong)dVar74 & 0x8000000000000000 | uVar31);
                  if ((uVar47 < 2) && ((iVar1 - iVar4) + 1 == iVar30)) {
                    dVar66 = 0.0;
                    if (0.0 <= (dVar58 + dVar58) * (dVar56 + dVar56)) {
                      dVar65 = ABS(dVar56 + dVar56);
                      dVar66 = ABS(dVar58 + dVar58);
                      if (dVar65 <= dVar66) {
                        dVar66 = dVar65;
                      }
                    }
                    dVar68 = dVar68 * -0.1 +
                             dVar29 * 0.6666666666666666 +
                             dVar57 * -1.0666666666666667 + dVar28 * 0.5;
                    dVar75 = (double)((ulong)dVar68 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else {
                    dVar59 = ABS(dVar76);
                    if (dVar60 <= ABS(dVar76)) {
                      dVar59 = dVar60;
                    }
                    dVar68 = dVar72 * 1.3333333333333333 +
                             (dVar61 + dVar65 * dVar59) * -0.16666666666666666;
                    if ((uVar47 < 2) && ((iVar1 - iVar4) + 2 == iVar30)) {
                      dVar61 = pdVar19[lVar41 + lVar46 + iVar38 + lVar40];
                      dVar68 = pdVar19[lVar41 + lVar46 + lVar36 + lVar40] - dVar61;
                      dVar76 = dVar61 - pdVar19[lVar41 + lVar46 + lVar35 + lVar40];
                      dVar68 = dVar68 + dVar68;
                      dVar76 = dVar76 + dVar76;
                      uVar70 = 0;
                      uVar71 = 0;
                      if (0.0 <= dVar76 * dVar68) {
                        dVar68 = ABS(dVar68);
                        dVar76 = ABS(dVar76);
                        if (dVar76 <= dVar68) {
                          dVar68 = dVar76;
                        }
                        uVar70 = SUB84(dVar68,0);
                        uVar71 = (undefined4)((ulong)dVar68 >> 0x20);
                      }
                      dVar68 = pdVar19[lVar41 + lVar46 + (iVar38 + 2) + lVar40] * -0.1 +
                               pdVar19[lVar41 + lVar46 + lVar36 + lVar40] * 0.6666666666666666 +
                               pdVar19[lVar41 + lVar46 + lVar35 + lVar40] * -1.0666666666666667 +
                               dVar61 * 0.5;
                      dVar61 = ABS(dVar68);
                      if ((double)CONCAT44(uVar71,uVar70) <= dVar61) {
                        dVar61 = (double)CONCAT44(uVar71,uVar70);
                      }
                      dVar61 = dVar61 * (double)((ulong)dVar68 & 0x8000000000000000 | uVar31);
                      dVar68 = dVar72 * 1.3333333333333333 +
                               (dVar65 * dVar59 + dVar61) * -0.16666666666666666;
                    }
                  }
                  if ((uVar45 < 2) && ((iVar2 + 1) - iVar4 == iVar30)) {
                    dVar66 = 0.0;
                    if (0.0 <= (dVar58 + dVar58) * (dVar56 + dVar56)) {
                      dVar65 = ABS(dVar56 + dVar56);
                      dVar66 = ABS(dVar58 + dVar58);
                      if (dVar65 <= dVar66) {
                        dVar66 = dVar65;
                      }
                    }
                    dVar68 = pdVar19[lVar41 + lVar46 + lVar40 + (iVar43 + -3 + iVar30)] * 0.1 +
                             dVar57 * -0.6666666666666666 +
                             dVar29 * 1.0666666666666667 + dVar28 * -0.5;
                    dVar75 = (double)((ulong)dVar68 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else if (!bVar54 && 1 >= uVar45) {
                    dVar57 = pdVar19[lVar41 + lVar46 + iVar39 + lVar40];
                    dVar65 = pdVar19[lVar41 + lVar46 + lVar37 + lVar40] - dVar57;
                    dVar58 = dVar57 - pdVar19[lVar41 + lVar46 + (int)(~uVar7 + iVar2) + lVar40];
                    dVar65 = dVar65 + dVar65;
                    dVar58 = dVar58 + dVar58;
                    dVar56 = 0.0;
                    if (0.0 <= dVar58 * dVar65) {
                      dVar56 = ABS(dVar65);
                      dVar58 = ABS(dVar58);
                      if (dVar58 <= dVar56) {
                        dVar56 = dVar58;
                      }
                    }
                    dVar65 = pdVar19[lVar41 + lVar46 + (iVar39 + -2) + lVar40] * 0.1 +
                             pdVar19[lVar41 + lVar46 + (int)(~uVar7 + iVar2) + lVar40] *
                             -0.6666666666666666 +
                             pdVar19[lVar41 + lVar46 + lVar37 + lVar40] * 1.0666666666666667 +
                             dVar57 * -0.5;
                    dVar57 = ABS(dVar65);
                    if (dVar56 <= dVar57) {
                      dVar57 = dVar56;
                    }
                    dVar68 = dVar72 * 1.3333333333333333 +
                             (dVar61 + dVar57 * (double)((ulong)dVar65 & 0x8000000000000000 | uVar31
                                                        )) * -0.16666666666666666;
                  }
                  dVar57 = ABS(dVar77);
                  if (local_2b8 <= ABS(dVar77)) {
                    dVar57 = local_2b8;
                  }
                  dVar65 = ABS(dVar68);
                  if (dVar66 <= ABS(dVar68)) {
                    dVar65 = dVar66;
                  }
                  pdVar50[lVar42] =
                       dVar65 * dVar75 *
                       (1.0 - *(double *)(lVar49 + -8 + lVar42 * 8) * dVar55) * 0.5 + dVar28;
                  pdVar34[lVar42] = dVar69 * dVar57 * (-1.0 - dVar78 * dVar55) * 0.5 + dVar29;
                  lVar42 = lVar42 + 1;
                } while ((iVar14 - iVar4) + 1 != (int)lVar42);
              }
              local_2c8 = local_2c8 + 1;
              pdVar34 = pdVar34 + lVar15;
              pdVar50 = pdVar50 + lVar16;
              lVar49 = lVar49 + lVar17 * 8;
              pdVar53 = pdVar53 + lVar18;
            } while (iVar52 + 1 != (int)local_2c8);
          }
          bVar54 = iVar32 != iVar13;
          iVar32 = iVar32 + 1;
        } while (bVar54);
      }
      local_1c8 = local_1c8 + 1;
      local_130 = local_130 + lVar25;
      local_138 = local_138 + lVar27;
      local_140 = local_140 + lVar21;
    } while (local_1c8 != (uint)ncomp);
  }
  return;
}

Assistant:

void
PLM::PredictVelOnXFace ( Box const& xebox, int ncomp,
                         Array4<Real> const& Imx, Array4<Real> const& Ipx,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= xebox.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= xebox.bigEnd(0)))
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,domain_ilo,domain_ihi,Imx,Ipx,dtdx,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                    (bc.lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                    (bc.hi(0) == BCType::hoextrap);

            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i  ,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
    else
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,Ipx,Imx,dtdx]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope(i  ,j,k,n,order,q);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope(i-1,j,k,n,order,q);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
}